

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindowPrivate::setSizeGrip(QMdiSubWindowPrivate *this,QSizeGrip *newSizeGrip)

{
  QWidget *this_00;
  QLayout *pQVar1;
  QWidgetData *pQVar2;
  bool bVar3;
  int iVar4;
  QStyle *style;
  QWidgetData *pQVar5;
  QSizeGrip *pQVar6;
  long in_FS_OFFSET;
  QSize local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSizeGrip != (QSizeGrip *)0x0) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    bVar3 = QPointer::operator_cast_to_bool((QPointer *)&this->sizeGrip);
    if ((!bVar3) &&
       (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 0x800) == 0)) {
      pQVar1 = (this->super_QWidgetPrivate).layout;
      if (pQVar1 != (QLayout *)0x0) {
        iVar4 = (**(code **)(*(long *)pQVar1 + 0xb8))(pQVar1,newSizeGrip);
        if (iVar4 != -1) goto LAB_00419ca7;
      }
      local_38 = (QSize)(**(code **)(*(long *)&newSizeGrip->super_QWidget + 0x70))(newSizeGrip);
      QWidget::setFixedSize(&newSizeGrip->super_QWidget,&local_38);
      pQVar1 = (this->super_QWidgetPrivate).layout;
      style = QWidget::style(this_00);
      bVar3 = isMacStyle(style);
      if ((bVar3) || (pQVar1 == (QLayout *)0x0)) {
        QWidget::setParent(&newSizeGrip->super_QWidget,this_00);
        bVar3 = QWidget::isLeftToRight(this_00);
        pQVar2 = this_00->data;
        if (bVar3) {
          pQVar5 = (newSizeGrip->super_QWidget).data;
          iVar4 = (((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) - (pQVar5->crect).x2.m_i) +
                  (pQVar5->crect).x1.m_i;
        }
        else {
          pQVar5 = (newSizeGrip->super_QWidget).data;
          iVar4 = 0;
        }
        QWidget::move(&newSizeGrip->super_QWidget,iVar4,
                      (((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) - (pQVar5->crect).y2.m_i) +
                      (pQVar5->crect).y1.m_i);
        pQVar6 = newSizeGrip;
        QWeakPointer<QObject>::assign<QObject>(&(this->sizeGrip).wp,(QObject *)newSizeGrip);
        iVar4 = (int)pQVar6;
      }
      else {
        QLayout::addWidget((this->super_QWidgetPrivate).layout,&newSizeGrip->super_QWidget);
        pQVar6 = newSizeGrip;
        QLayout::setAlignment
                  ((this->super_QWidgetPrivate).layout,&newSizeGrip->super_QWidget,(Alignment)0x42);
        iVar4 = (int)pQVar6;
      }
      QWidget::raise(&newSizeGrip->super_QWidget,iVar4);
      updateGeometryConstraints(this);
      QObject::installEventFilter((QObject *)newSizeGrip);
    }
  }
LAB_00419ca7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::setSizeGrip(QSizeGrip *newSizeGrip)
{
    Q_Q(QMdiSubWindow);
    if (!newSizeGrip || sizeGrip || q->windowFlags() & Qt::FramelessWindowHint)
        return;

    if (layout && layout->indexOf(newSizeGrip) != -1)
        return;
    newSizeGrip->setFixedSize(newSizeGrip->sizeHint());
    bool putSizeGripInLayout = layout ? true : false;
    if (isMacStyle(q->style()))
        putSizeGripInLayout = false;
    if (putSizeGripInLayout) {
        layout->addWidget(newSizeGrip);
        layout->setAlignment(newSizeGrip, Qt::AlignBottom | Qt::AlignRight);
    } else {
        newSizeGrip->setParent(q);
        newSizeGrip->move(q->isLeftToRight() ? q->width() - newSizeGrip->width() : 0,
                          q->height() - newSizeGrip->height());
        sizeGrip = newSizeGrip;
    }
    newSizeGrip->raise();
    updateGeometryConstraints();
    newSizeGrip->installEventFilter(q);
}